

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall cmCPackDebGenerator::InitializeInternal(cmCPackDebGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  string_view value;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CPACK_PACKAGING_INSTALL_PREFIX","");
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_38,"/usr");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CPACK_SET_DESTDIR","");
  cVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
  if (cVar4.Value == (string *)0x0) {
    bVar2 = true;
  }
  else {
    value._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar4.Value)->_M_string_length;
    bVar2 = cmValue::IsOff(value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CPACK_SET_DESTDIR","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_38,"I_ON");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar3;
}

Assistant:

int cmCPackDebGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (this->GetOption("CPACK_SET_DESTDIR").IsOff()) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  return this->Superclass::InitializeInternal();
}